

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_rotate_mem(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 pTVar1;
  TCGv_i32 shift;
  TCGv_i32 X;
  uint left;
  uintptr_t o;
  uint reg0;
  int mode;
  uint mode_00;
  TCGv_i32 addr;
  
  tcg_ctx = s->uc->tcg_ctx;
  mode_00 = insn >> 3 & 7;
  reg0 = insn & 7;
  pTVar1 = gen_ea_mode(env,s,mode_00,reg0,1,tcg_ctx->NULL_QREG,&addr,EA_LOADU,
                       (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (pTVar1 != tcg_ctx->NULL_QREG) {
    left = insn & 0x100;
    shift = tcg_const_i32_m68k(tcg_ctx,1);
    if ((insn >> 9 & 1) == 0) {
      X = rotate_x(tcg_ctx,pTVar1,shift,left,0x10);
      rotate_x_flags(tcg_ctx,pTVar1,X,0x10);
      tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(X + (long)tcg_ctx));
    }
    else {
      rotate(tcg_ctx,pTVar1,shift,left,0x10);
    }
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(shift + (long)tcg_ctx));
    pTVar1 = gen_ea_mode(env,s,mode_00,reg0,1,pTVar1,&addr,EA_STORE,
                         (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
    if (pTVar1 != tcg_ctx->NULL_QREG) {
      set_cc_op(s,CC_OP_FLAGS);
      return;
    }
  }
  gen_exception(s,(s->base).pc_next,3);
  return;
}

Assistant:

DISAS_INSN(rotate_mem)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src;
    TCGv addr;
    TCGv shift;
    int left = (insn & 0x100);

    SRC_EA(env, src, OS_WORD, 0, &addr);

    shift = tcg_const_i32(tcg_ctx, 1);
    if (insn & 0x0200) {
        rotate(tcg_ctx, src, shift, left, 16);
    } else {
        TCGv X = rotate_x(tcg_ctx, src, shift, left, 16);
        rotate_x_flags(tcg_ctx, src, X, 16);
        tcg_temp_free(tcg_ctx, X);
    }
    tcg_temp_free(tcg_ctx, shift);
    DEST_EA(env, insn, OS_WORD, src, &addr);
    set_cc_op(s, CC_OP_FLAGS);
}